

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void QHashPrivate::MultiNode<QByteArray,_QByteArray>::createInPlace<QByteArray>
               (MultiNode<QByteArray,_QByteArray> *n,QByteArray *k,QByteArray *args)

{
  MultiNode<QByteArray,_QByteArray> *this;
  QByteArray *in_RSI;
  Chain *in_RDI;
  QByteArray *in_stack_ffffffffffffffc8;
  
  this = (MultiNode<QByteArray,_QByteArray> *)operator_new(0x20);
  QByteArray::QByteArray(&in_RDI->value,in_stack_ffffffffffffffc8);
  this->value = (Chain *)0x0;
  MultiNode(this,in_RSI,in_RDI);
  return;
}

Assistant:

static void createInPlace(MultiNode *n, Key &&k, Args &&... args)
    { new (n) MultiNode(std::move(k), new Chain{ T(std::forward<Args>(args)...), nullptr }); }